

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

Reflection * google::protobuf::internal::GetReflectionOrDie(Message *m)

{
  ushort *puVar1;
  LogMessage *this;
  char *pcVar2;
  ulong uVar3;
  string_view str;
  string_view v;
  Metadata MVar4;
  LogMessage local_20;
  
  MVar4 = Message::GetMetadata(m);
  if (MVar4.reflection != (Reflection *)0x0) {
    return MVar4.reflection;
  }
  MVar4 = Message::GetMetadata(m);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops.cc"
             ,0x26);
  str._M_str = "Message does not support reflection (type ";
  str._M_len = 0x2a;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_20,str);
  if (MVar4.descriptor == (Descriptor *)0x0) {
    uVar3 = 7;
    pcVar2 = "unknown";
  }
  else {
    puVar1 = (ushort *)((MVar4.descriptor)->all_names_).payload_;
    uVar3 = (ulong)*puVar1;
    pcVar2 = (char *)((long)puVar1 + ~uVar3);
  }
  v._M_str = pcVar2;
  v._M_len = uVar3;
  this = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_20,v);
  absl::lts_20250127::log_internal::LogMessage::operator<<(this,(char (*) [3])0x328a74);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

static const Reflection* GetReflectionOrDie(const Message& m) {
  const Reflection* r = m.GetReflection();
  if (r == nullptr) {
    const Descriptor* d = m.GetDescriptor();
    // RawMessage is one known type for which GetReflection() returns nullptr.
    ABSL_LOG(FATAL) << "Message does not support reflection (type "
                    << (d ? d->name() : "unknown") << ").";
  }
  return r;
}